

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O0

void destroy_credits(void)

{
  char **ppcVar1;
  CREDIT_NAME *pCVar2;
  
  if ((title_text != (char *)0x0) && (title_alloced != 0)) {
    free(title_text);
  }
  while (credits != (CREDIT_NAME *)0x0) {
    cred = credits;
    pCVar2 = credits->next;
    if (credits->name != (char *)0x0) {
      ppcVar1 = &credits->name;
      credits = credits->next;
      free(*ppcVar1);
      pCVar2 = credits;
    }
    credits = pCVar2;
    if (cred->text != (char *)0x0) {
      free(cred->text);
    }
    free(cred);
  }
  return;
}

Assistant:

void destroy_credits(void)
{
   if ((title_text) && (title_alloced)) {
      free(title_text);
   }

   while (credits) {
      cred = credits;
      credits = cred->next;

      if (cred->name) {
         free(cred->name);
      }

      if (cred->text) {
         free(cred->text);
      }

      free(cred);
   }
}